

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O2

void __thiscall TApp_CheckSubcomFail_Test::TestBody(TApp_CheckSubcomFail_Test *this)

{
  input_t *args;
  bool bVar1;
  AssertHelper local_40;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38 [4];
  
  std::__cxx11::string::string((string *)local_38,"subcom",(allocator *)&local_40);
  args = &(this->super_TApp).args;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)args,local_38,
             &stack0xffffffffffffffe8);
  std::__cxx11::string::~string((string *)local_38);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    CLI::App::_parse_subcommand(&(this->super_TApp).app,args);
  }
  testing::Message::Message((Message *)local_38);
  testing::internal::AssertHelper::AssertHelper
            (&local_40,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x4f9,
             "Expected: CLI::detail::AppFriend::parse_subcommand(&app, args) throws an exception of type CLI::HorribleError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_40,(Message *)local_38);
  testing::internal::AssertHelper::~AssertHelper(&local_40);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(local_38);
  return;
}

Assistant:

TEST_F(TApp, CheckSubcomFail) {
    args = {"subcom"};

    EXPECT_THROW(CLI::detail::AppFriend::parse_subcommand(&app, args), CLI::HorribleError);
}